

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QFbWindow_*>::move(QList<QFbWindow_*> *this,qsizetype from,qsizetype to)

{
  long lVar1;
  long lVar2;
  Data *pDVar3;
  QFbWindow **ppQVar4;
  QFbWindow **ppQVar5;
  
  if (from == to) {
    return;
  }
  pDVar3 = (this->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QFbWindow_*>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QFbWindow_*> *)0x0);
  }
  ppQVar4 = (this->d).ptr;
  if (from < to) {
    lVar1 = from * 8;
    ppQVar5 = ppQVar4 + from + 1;
    lVar2 = to * 8;
  }
  else {
    lVar1 = to * 8;
    ppQVar5 = ppQVar4 + from;
    lVar2 = from * 8;
  }
  std::_V2::__rotate<QFbWindow**>((long)ppQVar4 + lVar1,ppQVar5,(long)ppQVar4 + lVar2 + 8);
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }